

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture1.c
# Opt level: O0

ktx_error_code_e
ktxTexture1_SetImageFromStdioStream
          (ktxTexture1 *This,ktx_uint32_t level,ktx_uint32_t layer,ktx_uint32_t faceSlice,FILE *src,
          ktx_size_t srcSize)

{
  ktx_size_t srcSize_local;
  FILE *src_local;
  ktx_uint32_t faceSlice_local;
  ktx_uint32_t layer_local;
  ktx_uint32_t level_local;
  ktxTexture1 *This_local;
  
  return KTX_INVALID_OPERATION;
}

Assistant:

KTX_error_code
ktxTexture1_SetImageFromStdioStream(ktxTexture1* This, ktx_uint32_t level,
                                    ktx_uint32_t layer, ktx_uint32_t faceSlice,
                                    FILE* src, ktx_size_t srcSize)
{
    UNUSED(This);
    UNUSED(level);
    UNUSED(layer);
    UNUSED(faceSlice);
    UNUSED(src);
    UNUSED(srcSize);
    return KTX_INVALID_OPERATION;
}